

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O3

ImmutablePatternModifier * __thiscall
icu_63::number::impl::MutablePatternModifier::createImmutableAndChain
          (MutablePatternModifier *this,MicroPropsGenerator *parent,UErrorCode *status)

{
  Form FVar1;
  PluralRules *pPVar2;
  int iVar3;
  AdoptingModifierStore *pAVar4;
  ConstantMultiFieldModifier *pCVar5;
  _func_int **pp_Var6;
  ImmutablePatternModifier *pIVar7;
  long lVar8;
  UErrorCode *pUVar9;
  UErrorCode statusLocal;
  
  pAVar4 = (AdoptingModifierStore *)UMemory::operator_new((UMemory *)0x98,(size_t)parent);
  if (pAVar4 == (AdoptingModifierStore *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    (pAVar4->super_ModifierStore)._vptr_ModifierStore =
         (_func_int **)&PTR__AdoptingModifierStore_00477148;
    memset(pAVar4->mods,0,0x90);
    iVar3 = (*this->fPatternInfo->_vptr_AffixPatternProvider[9])(this->fPatternInfo,0xfffffff9);
    if ((char)iVar3 == '\0') {
      this->fSignum = '\x01';
      this->fPlural = COUNT;
      pCVar5 = createConstantModifier(this,status);
      pAVar4->mods[0x11] = &pCVar5->super_Modifier;
      this->fSignum = '\0';
      this->fPlural = COUNT;
      pCVar5 = createConstantModifier(this,status);
      pAVar4->mods[0x10] = &pCVar5->super_Modifier;
      this->fSignum = -1;
      this->fPlural = COUNT;
      pUVar9 = status;
      pCVar5 = createConstantModifier(this,status);
      pAVar4->mods[0xf] = &pCVar5->super_Modifier;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pIVar7 = (ImmutablePatternModifier *)UMemory::operator_new((UMemory *)0x20,(size_t)pUVar9);
        if (pIVar7 == (ImmutablePatternModifier *)0x0) {
          return (ImmutablePatternModifier *)0x0;
        }
        (pIVar7->super_MicroPropsGenerator)._vptr_MicroPropsGenerator =
             (_func_int **)&PTR__ImmutablePatternModifier_004775d8;
        (pIVar7->pm).super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>.ptr =
             pAVar4;
        pIVar7->rules = (PluralRules *)0x0;
        pIVar7->parent = parent;
        return pIVar7;
      }
      pp_Var6 = (pAVar4->super_ModifierStore)._vptr_ModifierStore;
    }
    else {
      lVar8 = 0;
      do {
        FVar1 = *(Form *)((long)createImmutableAndChain::STANDARD_PLURAL_VALUES + lVar8);
        this->fSignum = '\x01';
        this->fPlural = FVar1;
        pCVar5 = createConstantModifier(this,status);
        pAVar4->mods[(long)(int)FVar1 * 3 + 2] = &pCVar5->super_Modifier;
        this->fSignum = '\0';
        this->fPlural = FVar1;
        pCVar5 = createConstantModifier(this,status);
        pAVar4->mods[(long)(int)(FVar1 * 3) + 1] = &pCVar5->super_Modifier;
        this->fSignum = -1;
        this->fPlural = FVar1;
        pUVar9 = status;
        pCVar5 = createConstantModifier(this,status);
        pAVar4->mods[(int)(FVar1 * 3)] = &pCVar5->super_Modifier;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x18);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pIVar7 = (ImmutablePatternModifier *)UMemory::operator_new((UMemory *)0x20,(size_t)pUVar9);
        if (pIVar7 == (ImmutablePatternModifier *)0x0) {
          return (ImmutablePatternModifier *)0x0;
        }
        pPVar2 = this->fRules;
        (pIVar7->super_MicroPropsGenerator)._vptr_MicroPropsGenerator =
             (_func_int **)&PTR__ImmutablePatternModifier_004775d8;
        (pIVar7->pm).super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>.ptr =
             pAVar4;
        pIVar7->rules = pPVar2;
        pIVar7->parent = parent;
        return pIVar7;
      }
      pp_Var6 = (pAVar4->super_ModifierStore)._vptr_ModifierStore;
    }
    (*pp_Var6[1])(pAVar4);
  }
  return (ImmutablePatternModifier *)0x0;
}

Assistant:

ImmutablePatternModifier*
MutablePatternModifier::createImmutableAndChain(const MicroPropsGenerator* parent, UErrorCode& status) {

    // TODO: Move StandardPlural VALUES to standardplural.h
    static const StandardPlural::Form STANDARD_PLURAL_VALUES[] = {
            StandardPlural::Form::ZERO,
            StandardPlural::Form::ONE,
            StandardPlural::Form::TWO,
            StandardPlural::Form::FEW,
            StandardPlural::Form::MANY,
            StandardPlural::Form::OTHER};

    auto pm = new AdoptingModifierStore();
    if (pm == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }

    if (needsPlurals()) {
        // Slower path when we require the plural keyword.
        for (StandardPlural::Form plural : STANDARD_PLURAL_VALUES) {
            setNumberProperties(1, plural);
            pm->adoptModifier(1, plural, createConstantModifier(status));
            setNumberProperties(0, plural);
            pm->adoptModifier(0, plural, createConstantModifier(status));
            setNumberProperties(-1, plural);
            pm->adoptModifier(-1, plural, createConstantModifier(status));
        }
        if (U_FAILURE(status)) {
            delete pm;
            return nullptr;
        }
        return new ImmutablePatternModifier(pm, fRules, parent);  // adopts pm
    } else {
        // Faster path when plural keyword is not needed.
        setNumberProperties(1, StandardPlural::Form::COUNT);
        pm->adoptModifierWithoutPlural(1, createConstantModifier(status));
        setNumberProperties(0, StandardPlural::Form::COUNT);
        pm->adoptModifierWithoutPlural(0, createConstantModifier(status));
        setNumberProperties(-1, StandardPlural::Form::COUNT);
        pm->adoptModifierWithoutPlural(-1, createConstantModifier(status));
        if (U_FAILURE(status)) {
            delete pm;
            return nullptr;
        }
        return new ImmutablePatternModifier(pm, nullptr, parent);  // adopts pm
    }
}